

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# button_widgets.cpp
# Opt level: O0

void Am_Widget_General_Undo_Redo(Am_Object *command_obj,bool undo,bool selective)

{
  bool bVar1;
  Am_Value *pAVar2;
  Am_Object local_60;
  Am_Object local_58;
  Am_Object widget;
  Am_Object inter;
  undefined1 local_38 [8];
  Am_Value old_value;
  Am_Value new_value;
  bool selective_local;
  bool undo_local;
  Am_Object *command_obj_local;
  
  Am_Value::Am_Value((Am_Value *)&old_value.value);
  Am_Value::Am_Value((Am_Value *)local_38);
  Am_Object::Am_Object(&widget);
  Am_Object::Am_Object(&local_58);
  pAVar2 = Am_Object::Get(command_obj,0x170,0);
  Am_Object::operator=(&widget,pAVar2);
  bVar1 = Am_Object::Valid(&widget);
  if (bVar1) {
    Am_Object::Get_Owner(&local_60,(Am_Slot_Flags)&widget);
    Am_Object::operator=(&local_58,&local_60);
    Am_Object::~Am_Object(&local_60);
  }
  if (selective) {
    bVar1 = Am_Object::Valid(&local_58);
    if (bVar1) {
      pAVar2 = Am_Object::Peek(&local_58,0x169,0);
      Am_Value::operator=((Am_Value *)&old_value.value,pAVar2);
    }
  }
  else {
    pAVar2 = Am_Object::Peek(command_obj,0x169,0);
    Am_Value::operator=((Am_Value *)&old_value.value,pAVar2);
  }
  if (undo) {
    pAVar2 = Am_Object::Peek(command_obj,0x16c,0);
    Am_Value::operator=((Am_Value *)local_38,pAVar2);
  }
  else {
    pAVar2 = Am_Object::Peek(command_obj,0x169,0);
    Am_Value::operator=((Am_Value *)local_38,pAVar2);
  }
  Am_Object::Set(command_obj,0x16c,(Am_Value *)&old_value.value,0);
  Am_Object::Set(command_obj,0x169,(Am_Value *)local_38,0);
  bVar1 = Am_Object::Valid(&local_58);
  if (bVar1) {
    Am_Object::Set(&local_58,0x16c,(Am_Value *)&old_value.value,1);
    Am_Object::Set(&local_58,0x169,(Am_Value *)local_38,0);
  }
  Am_Object::~Am_Object(&local_58);
  Am_Object::~Am_Object(&widget);
  Am_Value::~Am_Value((Am_Value *)local_38);
  Am_Value::~Am_Value((Am_Value *)&old_value.value);
  return;
}

Assistant:

void
Am_Widget_General_Undo_Redo(Am_Object command_obj, bool undo, bool selective)
{
  Am_Value new_value, old_value;
  Am_Object inter, widget;
  // this command was in the inter in the widget.  The SAVED_OLD_OWNER
  // will be the inter.  Want to actually set the widget.  The
  // old_value in the command object is for the widget, not for the
  // interactor.  The interactor's value is reset by impl_command.
  inter = command_obj.Get(Am_SAVED_OLD_OWNER);
  if (inter.Valid())
    widget = inter.Get_Owner();

  if (selective) { // then get current value from the interactor
    if (widget.Valid())
      new_value = widget.Peek(Am_VALUE);
  } else // get current value from the command_obj
    new_value = command_obj.Peek(Am_VALUE);

  if (undo)
    old_value = command_obj.Peek(Am_OLD_VALUE);
  else // repeat
    old_value = command_obj.Peek(Am_VALUE);

  command_obj.Set(Am_OLD_VALUE, new_value);
  command_obj.Set(Am_VALUE, old_value);
  //also set widget
  if (widget.Valid()) {
#ifdef DEBUG
    if (Am_Inter_Tracing(Am_INTER_TRACE_SETTING)) {
      std::cout << "++ ";
      if (selective)
        std::cout << "selective ";
      if (undo)
        std::cout << "undo ";
      else
        std::cout << "repeat ";
      std::cout << "setting the Am_VALUE of " << widget << " to " << old_value
                << std::endl
                << std::flush;
    }
#endif
    widget.Set(Am_OLD_VALUE, new_value, Am_OK_IF_NOT_THERE);
    widget.Set(Am_VALUE, old_value);
  }
}